

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::EnumValueDescriptorProto::ByteSize(EnumValueDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  EnumValueOptions *this_00;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar6 = (uint)bVar1;
  iVar4 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      psVar2 = this->name_;
      uVar7 = (uint)psVar2->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar7) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        uVar7 = (uint)psVar2->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar4 = uVar7 + iVar4 + 1;
    }
    if ((uVar6 & 2) != 0) {
      uVar7 = this->number_;
      if ((int)uVar7 < 0) {
        iVar5 = 0xb;
      }
      else {
        iVar5 = 2;
        if (0x7f < uVar7) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
          iVar5 = iVar5 + 1;
          uVar6 = this->_has_bits_[0];
        }
      }
      iVar4 = iVar4 + iVar5;
    }
    if ((uVar6 & 4) != 0) {
      this_00 = this->options_;
      if (this_00 == (EnumValueOptions *)0x0) {
        this_00 = *(EnumValueOptions **)(default_instance_ + 0x18);
      }
      uVar6 = EnumValueOptions::ByteSize(this_00);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5 + 1;
    }
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar5 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int EnumValueDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional int32 number = 2;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional .google.protobuf.EnumValueOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}